

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_unordered_m68k(float128 a,float128 b,float_status *status)

{
  int iVar1;
  
  if ((((~a.high & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       a.low != 0)) ||
     ((iVar1 = 0, (~b.high & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       b.low != 0)))) {
    status->float_exception_flags = status->float_exception_flags | 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int float128_unordered(float128 a, float128 b, float_status *status)
{
    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}